

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

bool __thiscall kj::HttpHeaders::parseHeaders(HttpHeaders *this,char *ptr,char *end)

{
  byte *pbVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  size_t sVar6;
  char *start;
  StringPtr value;
  StringPtr name;
  char *local_38;
  
  cVar2 = *ptr;
  while( true ) {
    if (cVar2 == '\0') {
      return ptr == end;
    }
    pcVar4 = ptr + -1;
    sVar6 = 0;
    local_38 = ptr;
    do {
      local_38 = local_38 + 1;
      pbVar1 = (byte *)(pcVar4 + 1);
      uVar5 = (ulong)*pbVar1;
      pcVar4 = pcVar4 + 1;
      sVar6 = sVar6 + 1;
      pcVar3 = pcVar4;
    } while ((*(ulong *)((anonymous_namespace)::HTTP_HEADER_NAME_CHARS + (ulong)(*pbVar1 >> 6) * 8)
              >> (uVar5 & 0x3f) & 1) != 0);
    while (((char)uVar5 == ' ' || ((int)uVar5 == 9))) {
      local_38 = local_38 + 1;
      uVar5 = (ulong)(byte)pcVar3[1];
      pcVar3 = pcVar3 + 1;
    }
    if (sVar6 == 1) break;
    if ((char)uVar5 != ':') {
      return false;
    }
    for (; (*local_38 == ' ' || (*local_38 == '\t')); local_38 = local_38 + 1) {
    }
    *pcVar4 = '\0';
    value = consumeLine(&local_38);
    name.content.size_ = sVar6;
    name.content.ptr = ptr;
    addNoCheck(this,name,value);
    cVar2 = *local_38;
    ptr = local_38;
  }
  return false;
}

Assistant:

bool HttpHeaders::parseHeaders(char* ptr, char* end) {
  while (*ptr != '\0') {
    KJ_IF_SOME(name, consumeHeaderName(ptr)) {
      kj::StringPtr line = consumeLine(ptr);
      addNoCheck(name, line);
    } else {
      return false;
    }
  }

  return ptr == end;
}